

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O3

string * __thiscall
r_comp::RepliStruct::printError_abi_cxx11_(string *__return_storage_ptr__,RepliStruct *this)

{
  pointer pcVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  RepliStruct *pRVar6;
  char *pcVar7;
  pointer psVar8;
  string com;
  stringstream strError;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((this->error)._M_string_length != 0) {
    pcVar1 = (this->cmd)._M_dataplus._M_p;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,pcVar1 + (this->cmd)._M_string_length);
    pRVar6 = this;
    while (((this->cmd)._M_string_length == 0 &&
           (pRVar6 = pRVar6->parent, pRVar6 != (RepliStruct *)0x0))) {
      std::__cxx11::string::_M_assign((string *)&local_1e0);
    }
    poVar4 = local_1a8;
    if (local_1e0._M_string_length == 0) {
      lVar5 = 5;
      pcVar7 = "Error";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Error in structure \'",0x14);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      lVar5 = 1;
      pcVar7 = "\'";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar5);
    if (this->line != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," line ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,": ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->error)._M_dataplus._M_p,(this->error)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
  }
  psVar8 = (this->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = __return_storage_ptr__;
  if (psVar8 != psVar2) {
    do {
      pRVar6 = (psVar8->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar8->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      printError_abi_cxx11_(&local_1e0,pRVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  psVar3 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string RepliStruct::printError() const
{
    std::stringstream strError;

    if (error.size() > 0) {
        std::string com = cmd;
        RepliStruct* structure = parent;

        while ((cmd.size() == 0) && (structure != nullptr)) {
            com = structure->cmd;
            structure = structure->parent;
        }

        if (com.size() == 0) {
            strError << "Error";
        } else {
            strError << "Error in structure '" << com << "'";
        }

        if (line > 0) {
            strError << " line " << line;
        }

        strError << ": " << error << std::endl;
    }

    for (RepliStruct::Ptr arg : args) {
        strError << arg->printError();
    }

    return strError.str();
}